

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

int NULLCFile::FileReadType<short>(short *data,File *file)

{
  size_t sVar1;
  char *error;
  
  if (file == (File *)0x0) {
    error = "ERROR: null pointer access";
  }
  else {
    if ((FILE *)file->handle != (FILE *)0x0) {
      sVar1 = fread(data,2,1,(FILE *)file->handle);
      return (uint)(sVar1 == 1);
    }
    error = "Cannot read from a closed file.";
  }
  nullcThrowError(error);
  return 0;
}

Assistant:

int FileReadType(T* data, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot read from a closed file.");
			return 0;
		}

		return 1 == fread(data, sizeof(T), 1, file->handle);
	}